

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O0

void testScanLineApi(string *tempDir)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  undefined8 in_RDI;
  Array2D<float> *unaff_retaddr;
  Array2D<Imath_3_2::half> *in_stack_00000008;
  Array2D<unsigned_int> *in_stack_00000010;
  string *in_stack_00000018;
  LineOrder in_stack_00000050;
  Compression in_stack_00000058;
  LevelRoundingMode in_stack_00000060;
  int in_stack_00000068;
  int in_stack_00000070;
  int in_stack_00000078;
  exception *e;
  int rmode;
  int lorder;
  int n;
  int maxThreads;
  Array2D<float> pf;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  int DY;
  int DX;
  int H;
  int W;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Array2D<float> *in_stack_ffffffffffffff30;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff38;
  Array2D<unsigned_int> *in_stack_ffffffffffffff40;
  int local_80;
  int local_7c;
  int local_78;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing the scanline API for tiled files");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  anon_unknown.dwarf_21e8e4::fillPixels
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  bVar1 = IlmThread_3_4::supportsThreads();
  iVar2 = 0;
  if ((bVar1 & 1) != 0) {
    iVar2 = 3;
  }
  for (local_78 = 0; local_78 <= iVar2; local_78 = local_78 + 1) {
    bVar1 = IlmThread_3_4::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_3_4::setGlobalThreadCount(local_78);
      poVar4 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar3 = Imf_3_4::globalThreadCount();
      this = (void *)std::ostream::operator<<(poVar4,iVar3);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
      for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
        in_stack_ffffffffffffff00 = 3;
        anon_unknown.dwarf_21e8e4::writeRead
                  (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000050,in_stack_00000058,
                   in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,(int)e);
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imf_3_4::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Imf_3_4::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
  ;
  return;
}

Assistant:

void
testScanLineApi (const std::string& tempDir)
{
    try
    {
        cout << "Testing the scanline API for tiled files" << endl;

        const int W  = 48;
        const int H  = 81;
        const int DX = -17;
        const int DY = -29;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);
        fillPixels (pi, ph, pf, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int lorder = 0; lorder < NUM_LINEORDERS; ++lorder)
            {
                for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
                {
                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        1,
                        1);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        24,
                        26);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        48,
                        81);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        0,
                        0,
                        128,
                        96);

                    writeRead (
                        tempDir,
                        pi,
                        ph,
                        pf,
                        W,
                        H,
                        LineOrder (lorder),
                        ZIP_COMPRESSION,
                        LevelRoundingMode (rmode),
                        DX,
                        DY,
                        128,
                        96);
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}